

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::EndColumns(void)

{
  float _y;
  ImDrawList *this;
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiWindow *pIVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ImGuiCol local_7c;
  float x_1;
  ImVec2 local_68;
  float local_60;
  ImU32 local_5c;
  float xi;
  ImU32 col;
  bool held;
  bool hovered;
  ImVec2 local_4c;
  undefined1 local_44 [8];
  ImRect column_rect;
  float column_w;
  ImGuiID column_id;
  float x;
  int i;
  int dragging_column;
  float y2;
  float y1;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  pIVar3 = GetCurrentWindow();
  if ((pIVar3->DC).ColumnsCount < 2) {
    __assert_fail("window->DC.ColumnsCount > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui.cpp"
                  ,0x27e3,"void ImGui::EndColumns()");
  }
  PopItemWidth();
  PopClipRect();
  ImDrawList::ChannelsMerge(pIVar3->DrawList);
  fVar4 = ImMax((pIVar3->DC).ColumnsCellMaxY,(pIVar3->DC).CursorPos.y);
  (pIVar3->DC).ColumnsCellMaxY = fVar4;
  (pIVar3->DC).CursorPos.y = (pIVar3->DC).ColumnsCellMaxY;
  fVar4 = ImMax((pIVar3->DC).ColumnsStartMaxPosX,(pIVar3->DC).ColumnsMaxX);
  (pIVar3->DC).CursorMaxPos.x = fVar4;
  if ((((pIVar3->DC).ColumnsFlags & 1U) == 0) && ((pIVar3->SkipItems & 1U) == 0)) {
    fVar4 = (pIVar3->DC).ColumnsStartPosY;
    _y = (pIVar3->DC).CursorPos.y;
    x = -NAN;
    for (column_id = 1; (int)column_id < (pIVar3->DC).ColumnsCount; column_id = column_id + 1) {
      fVar6 = (pIVar3->Pos).x;
      fVar5 = GetColumnOffset(column_id);
      fVar6 = fVar6 + fVar5;
      column_rect.Max.y = (float)((pIVar3->DC).ColumnsSetId + column_id);
      column_rect.Max.x = 4.0;
      ImVec2::ImVec2(&local_4c,fVar6 - 4.0,fVar4);
      ImVec2::ImVec2((ImVec2 *)&col,fVar6 + 4.0,_y);
      ImRect::ImRect((ImRect *)local_44,&local_4c,(ImVec2 *)&col);
      bVar2 = IsClippedEx((ImRect *)local_44,(ImGuiID *)&column_rect.Max.y,false);
      if (!bVar2) {
        xi._3_1_ = 0;
        xi._2_1_ = 0;
        if (((pIVar3->DC).ColumnsFlags & 2U) == 0) {
          ButtonBehavior((ImRect *)local_44,(ImGuiID)column_rect.Max.y,(bool *)((long)&xi + 3),
                         (bool *)((long)&xi + 2),0);
          if (((xi._3_1_ & 1) != 0) || ((xi._2_1_ & 1) != 0)) {
            pIVar1->MouseCursor = 4;
          }
          if (((xi._2_1_ & 1) != 0) && ((pIVar1->ActiveIdIsJustActivated & 1U) != 0)) {
            (pIVar1->ActiveIdClickOffset).x = (pIVar1->ActiveIdClickOffset).x - 4.0;
          }
          if ((xi._2_1_ & 1) != 0) {
            x = (float)column_id;
          }
        }
        if ((xi._2_1_ & 1) == 0) {
          local_7c = 0x1c;
          if ((xi._3_1_ & 1) != 0) {
            local_7c = 0x1d;
          }
        }
        else {
          local_7c = 0x1e;
        }
        local_5c = GetColorU32(local_7c,1.0);
        local_60 = (float)(int)fVar6;
        this = pIVar3->DrawList;
        ImVec2::ImVec2(&local_68,local_60,fVar4 + 1.0);
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff90,local_60,_y);
        ImDrawList::AddLine(this,&local_68,(ImVec2 *)&stack0xffffffffffffff90,local_5c,1.0);
      }
    }
    if (x != -NAN) {
      fVar4 = GetDraggedColumnOffset((int)x);
      SetColumnOffset((int)x,fVar4);
    }
  }
  (pIVar3->DC).ColumnsSetId = 0;
  (pIVar3->DC).ColumnsCurrent = 0;
  (pIVar3->DC).ColumnsCount = 1;
  (pIVar3->DC).ColumnsFlags = 0;
  ImVector<ImGuiColumnData>::resize(&(pIVar3->DC).ColumnsData,0);
  (pIVar3->DC).ColumnsOffsetX = 0.0;
  (pIVar3->DC).CursorPos.x =
       (float)(int)((pIVar3->Pos).x + (pIVar3->DC).IndentX + (pIVar3->DC).ColumnsOffsetX);
  return;
}

Assistant:

void ImGui::EndColumns()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    IM_ASSERT(window->DC.ColumnsCount > 1);

    PopItemWidth();
    PopClipRect();
    window->DrawList->ChannelsMerge();

    window->DC.ColumnsCellMaxY = ImMax(window->DC.ColumnsCellMaxY, window->DC.CursorPos.y);
    window->DC.CursorPos.y = window->DC.ColumnsCellMaxY;
    window->DC.CursorMaxPos.x = ImMax(window->DC.ColumnsStartMaxPosX, window->DC.ColumnsMaxX);  // Columns don't grow parent

    // Draw columns borders and handle resize
    if (!(window->DC.ColumnsFlags & ImGuiColumnsFlags_NoBorder) && !window->SkipItems)
    {
        const float y1 = window->DC.ColumnsStartPosY;
        const float y2 = window->DC.CursorPos.y;
        int dragging_column = -1;
        for (int i = 1; i < window->DC.ColumnsCount; i++)
        {
            float x = window->Pos.x + GetColumnOffset(i);
            const ImGuiID column_id = window->DC.ColumnsSetId + ImGuiID(i);
            const float column_w = 4.0f; // Width for interaction
            const ImRect column_rect(ImVec2(x - column_w, y1), ImVec2(x + column_w, y2));
            if (IsClippedEx(column_rect, &column_id, false))
                continue;
            
            bool hovered = false, held = false;
            if (!(window->DC.ColumnsFlags & ImGuiColumnsFlags_NoResize))
            {
                ButtonBehavior(column_rect, column_id, &hovered, &held);
                if (hovered || held)
                    g.MouseCursor = ImGuiMouseCursor_ResizeEW;
                if (held && g.ActiveIdIsJustActivated)
                    g.ActiveIdClickOffset.x -= column_w; // Store from center of column line (we used a 8 wide rect for columns clicking). This is used by GetDraggedColumnOffset().
                if (held)
                    dragging_column = i;
            }

            // Draw column
            const ImU32 col = GetColorU32(held ? ImGuiCol_SeparatorActive : hovered ? ImGuiCol_SeparatorHovered : ImGuiCol_Separator);
            const float xi = (float)(int)x;
            window->DrawList->AddLine(ImVec2(xi, y1 + 1.0f), ImVec2(xi, y2), col);
        }

        // Apply dragging after drawing the column lines, so our rendered lines are in sync with how items were displayed during the frame.
        if (dragging_column != -1)
        {
            float x = GetDraggedColumnOffset(dragging_column);
            SetColumnOffset(dragging_column, x);
        }
    }

    window->DC.ColumnsSetId = 0;
    window->DC.ColumnsCurrent = 0;
    window->DC.ColumnsCount = 1;
    window->DC.ColumnsFlags = 0;
    window->DC.ColumnsData.resize(0);
    window->DC.ColumnsOffsetX = 0.0f;
    window->DC.CursorPos.x = (float)(int)(window->Pos.x + window->DC.IndentX + window->DC.ColumnsOffsetX);
}